

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O3

uint __thiscall
FMB::FiniteModelMultiSorted::args2var
          (FiniteModelMultiSorted *this,DArray<unsigned_int> *args,DArray<unsigned_int> *sizes,
          DArray<unsigned_int> *offsets,uint s,OperatorType *sig)

{
  uint uVar1;
  TermList TVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar4 = offsets->_array[s];
  uVar3 = args->_size;
  if (uVar3 != 0) {
    iVar5 = 1;
    uVar7 = 0;
    do {
      uVar1 = args->_array[uVar7];
      uVar6 = (uint)uVar7;
      if (uVar6 < sig->_typeArgsArity) {
        TVar2 = Kernel::AtomicSort::superSort();
        uVar3 = args->_size;
      }
      else {
        TVar2._content = *(uint64_t *)(sig->_key + (ulong)(uVar6 - sig->_typeArgsArity) * 8 + 8);
      }
      uVar4 = uVar4 + (uVar1 - 1) * iVar5;
      iVar5 = iVar5 * sizes->_array[*(uint *)(TVar2._content + 8)];
      uVar7 = (ulong)(uVar6 + 1);
    } while (uVar7 < uVar3);
  }
  return uVar4;
}

Assistant:

unsigned args2var(const DArray<unsigned>& args, const DArray<unsigned>& sizes,
                    const DArray<unsigned>& offsets, unsigned s, OperatorType* sig)
  {
    unsigned var = offsets[s];
    unsigned mult = 1;
    for(unsigned i=0;i<args.size();i++){
      var += mult*(args[i]-1);
      unsigned s = sig->arg(i).term()->functor();
      mult *=sizes[s];
    }
    return var;
  }